

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void Curl_http2_cleanup_dependencies(Curl_easy *data)

{
  Curl_easy *child;
  Curl_easy *tmp;
  Curl_easy *data_local;
  
  while ((data->set).stream_dependents != (Curl_http2_dep *)0x0) {
    child = ((data->set).stream_dependents)->data;
    Curl_http2_remove_child(data,child);
    if ((data->set).stream_depends_on != (Curl_easy *)0x0) {
      Curl_http2_add_child((data->set).stream_depends_on,child,false);
    }
  }
  if ((data->set).stream_depends_on != (Curl_easy *)0x0) {
    Curl_http2_remove_child((data->set).stream_depends_on,data);
  }
  return;
}

Assistant:

void Curl_http2_cleanup_dependencies(struct Curl_easy *data)
{
  while(data->set.stream_dependents) {
    struct Curl_easy *tmp = data->set.stream_dependents->data;
    Curl_http2_remove_child(data, tmp);
    if(data->set.stream_depends_on)
      Curl_http2_add_child(data->set.stream_depends_on, tmp, FALSE);
  }

  if(data->set.stream_depends_on)
    Curl_http2_remove_child(data->set.stream_depends_on, data);
}